

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O1

void __thiscall
OptionParser::parseReportItems
          (OptionParser *this,int nodeOrLink,Network *network,int nTokens,string *tokens)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  Node *pNVar5;
  InputError *pIVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *__to;
  char *extraout_RDX_01;
  long lVar7;
  string *psVar8;
  string local_a0;
  string local_80;
  string local_60;
  int local_3c;
  uint local_38;
  byte local_31;
  
  local_31 = nodeOrLink == 1;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_3c = nodeOrLink;
  local_38 = nTokens;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"NONE","");
  psVar8 = tokens + 1;
  bVar2 = Utilities::match(psVar8,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"ALL","");
  bVar3 = Utilities::match(psVar8,&local_60);
  iVar4 = (uint)!bVar2 * 2;
  __to = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
    __to = extraout_RDX_00;
  }
  if (bVar3) {
    iVar4 = 1;
  }
  if (iVar4 == 2) {
    if (local_3c == 0) {
      if (1 < (int)local_38) {
        psVar8 = tokens + 1;
        lVar7 = (ulong)local_38 - 1;
        do {
          pNVar5 = Network::node(network,psVar8);
          if (pNVar5 == (Node *)0x0) {
            pIVar6 = (InputError *)__cxa_allocate_exception(0x30);
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            pcVar1 = (psVar8->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a0,pcVar1,pcVar1 + psVar8->_M_string_length);
            InputError::InputError(pIVar6,5,&local_a0);
            __cxa_throw(pIVar6,&InputError::typeinfo,ENerror::~ENerror);
          }
          (pNVar5->super_Element).field_0x2c = 1;
          psVar8 = psVar8 + 1;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
    }
    else if (1 < (int)local_38) {
      lVar7 = (ulong)local_38 - 1;
      do {
        iVar4 = Network::link(network,(char *)psVar8,__to);
        if (CONCAT44(extraout_var,iVar4) == 0) {
          pIVar6 = (InputError *)__cxa_allocate_exception(0x30);
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          pcVar1 = (psVar8->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_80,pcVar1,pcVar1 + psVar8->_M_string_length);
          InputError::InputError(pIVar6,5,&local_80);
          __cxa_throw(pIVar6,&InputError::typeinfo,ENerror::~ENerror);
        }
        *(undefined1 *)(CONCAT44(extraout_var,iVar4) + 0x2c) = 1;
        psVar8 = psVar8 + 1;
        lVar7 = lVar7 + -1;
        __to = extraout_RDX_01;
      } while (lVar7 != 0);
    }
  }
  else {
    Options::setOption(&network->options,local_31 + REPORT_NODES,iVar4);
  }
  return;
}

Assistant:

void OptionParser::parseReportItems(int nodeOrLink, Network* network,
                                    int nTokens, string* tokens)
{
    // ... process NODES ALL/NONE & LINKS ALL/NONE options
    int value = Options::SOME;
    Options::IndexOption option = Options::REPORT_NODES;
    if ( nodeOrLink == Element::LINK ) option = Options::REPORT_LINKS;
    if ( Utilities::match(tokens[1], "NONE") ) value = Options::NONE;
    if ( Utilities::match(tokens[1], "ALL") )  value = Options::ALL;
    if ( value != Options::SOME )
    {
        network->options.setOption(option, value);
        return;
    }

    // ... process NODES  n1  n2  etc. option
    if ( nodeOrLink == Element::NODE )
    {
        for (int i = 1; i < nTokens; i++)
        {
            Node* node = network->node(tokens[i]);
            if ( node == nullptr )
            {
                throw InputError(InputError::UNDEFINED_OBJECT, tokens[i]);
            }
            node->rptFlag = true;
        }
    }

    // ... process LINKS l1  l2  etc. option
    else
    {
        for (int i = 1; i < nTokens; i++)
        {
            Link* link = network->link(tokens[i]);
            if ( link == nullptr )
            {
                throw InputError(InputError::UNDEFINED_OBJECT, tokens[i]);
            }
            link->rptFlag = true;
        }
    }
}